

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O2

void __thiscall HEkkDual::minorChooseRow(HEkkDual *this)

{
  MChoice *pMVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  
  this->multi_iChoice = -1;
  pdVar8 = &this->multi_choice[0].infeasEdWt;
  dVar11 = 0.0;
  uVar10 = 0xffffffffffffffff;
  for (uVar9 = 0; (long)uVar9 < (long)this->multi_num; uVar9 = uVar9 + 1) {
    if ((-1 < ((MChoice *)(pdVar8 + -5))->row_out) &&
       (dVar2 = pdVar8[-1], dVar3 = *pdVar8, dVar11 < dVar2 / dVar3)) {
      this->multi_iChoice = (HighsInt)uVar9;
      uVar10 = uVar9 & 0xffffffff;
      dVar11 = dVar2 / dVar3;
    }
    pdVar8 = pdVar8 + 0x49;
  }
  this->row_out = -1;
  iVar7 = (int)uVar10;
  if (iVar7 != -1) {
    pMVar1 = this->multi_choice + iVar7;
    iVar4 = pMVar1->row_out;
    this->row_out = iVar4;
    iVar5 = (this->ekk_instance_->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar4];
    this->variable_out = iVar5;
    uVar10 = -(ulong)(pMVar1->baseValue < pMVar1->baseLower);
    dVar11 = pMVar1->baseValue -
             (double)(~uVar10 & (ulong)pMVar1->baseUpper | (ulong)pMVar1->baseLower & uVar10);
    this->delta_primal = dVar11;
    this->move_out = (uint)(0.0 <= dVar11) * 2 + -1;
    iVar6 = this->multi_nFinish;
    this->multi_finish[iVar6].row_out = iVar4;
    this->multi_finish[iVar6].variable_out = iVar5;
    this->multi_finish[iVar6].row_ep = &pMVar1->row_ep;
    this->multi_finish[iVar6].col_aq = &this->multi_choice[iVar7].col_aq;
    this->multi_finish[iVar6].col_BFRT = &this->multi_choice[iVar7].col_BFRT;
    this->multi_finish[iVar6].EdWt = pMVar1->infeasEdWt;
    pMVar1->row_out = -1;
  }
  return;
}

Assistant:

void HEkkDual::minorChooseRow() {
  /**
   * 1. Find which to go out
   *        Because we had other checking code
   *        We know current best is OK to be used
   */
  multi_iChoice = -1;
  double bestMerit = 0;
  for (HighsInt ich = 0; ich < multi_num; ich++) {
    const HighsInt iRow = multi_choice[ich].row_out;
    if (iRow < 0) continue;
    double infeasValue = multi_choice[ich].infeasValue;
    double infeasEdWt = multi_choice[ich].infeasEdWt;
    double infeasMerit = infeasValue / infeasEdWt;
    if (bestMerit < infeasMerit) {
      bestMerit = infeasMerit;
      multi_iChoice = ich;
    }
  }

  /**
   * 2. Obtain other info for current sub-optimization choice
   */
  row_out = kNoRowChosen;
  if (multi_iChoice != -1) {
    MChoice* workChoice = &multi_choice[multi_iChoice];

    // Assign useful variables
    row_out = workChoice->row_out;
    variable_out = ekk_instance_.basis_.basicIndex_[row_out];
    double valueOut = workChoice->baseValue;
    double lowerOut = workChoice->baseLower;
    double upperOut = workChoice->baseUpper;
    delta_primal = valueOut - (valueOut < lowerOut ? lowerOut : upperOut);
    move_out = delta_primal < 0 ? -1 : 1;

    // Assign buffers
    MFinish* finish = &multi_finish[multi_nFinish];
    finish->row_out = row_out;
    finish->variable_out = variable_out;
    finish->row_ep = &workChoice->row_ep;
    finish->col_aq = &workChoice->col_aq;
    finish->col_BFRT = &workChoice->col_BFRT;
    // Save the edge weight - over-written later when using Devex
    finish->EdWt = workChoice->infeasEdWt;

    // Disable current row
    workChoice->row_out = kNoRowChosen;
  }
}